

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructDeserializer.hpp
# Opt level: O2

void mserialize::
     StructDeserializer<binlog::ClockSync,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockValue>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockFrequency>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::nsSinceEpoch>,_std::integral_constant<int_binlog::ClockSync::*,_&binlog::ClockSync::tzOffset>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::ClockSync::*,_&binlog::ClockSync::tzName>_>
     ::deserialize<binlog::Range>(ClockSync *t,Range *istream)

{
  detail::TrivialDeserializer<unsigned_long>::deserialize<binlog::Range>(&t->clockValue,istream);
  detail::TrivialDeserializer<unsigned_long>::deserialize<binlog::Range>(&t->clockFrequency,istream)
  ;
  detail::TrivialDeserializer<unsigned_long>::deserialize<binlog::Range>(&t->nsSinceEpoch,istream);
  detail::TrivialDeserializer<int>::deserialize<binlog::Range>(&t->tzOffset,istream);
  detail::
  BuiltinDeserializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::deserialize<binlog::Range>(&t->tzName,istream);
  return;
}

Assistant:

static void deserialize(T& t, InputStream& istream)
  {
    using swallow = int[];
    (void)swallow{1, (deserialize_member(t, Members::value, istream), int{})...};
  }